

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cpp
# Opt level: O1

result<sockpp::acceptor> *
sockpp::acceptor::create(result<sockpp::acceptor> *__return_storage_ptr__,int domain)

{
  error_category *peVar1;
  result<int> res;
  result<int> local_60;
  undefined **local_48;
  undefined4 local_40;
  socket local_38;
  
  socket::create_handle(&local_60,domain,1,0);
  if (local_60.err_._M_value == 0) {
    local_48 = &PTR__socket_0010ca00;
    (__return_storage_ptr__->val_).super_socket._vptr_socket = (_func_int **)&PTR__socket_0010cba0;
    (__return_storage_ptr__->val_).super_socket.handle_ = local_60.val_;
    local_40 = 0xffffffff;
    (__return_storage_ptr__->val_).super_socket._vptr_socket = (_func_int **)&PTR__socket_0010ca00;
    (__return_storage_ptr__->err_)._M_value = 0;
    peVar1 = (error_category *)std::_V2::system_category();
    (__return_storage_ptr__->err_)._M_cat = peVar1;
    local_48 = &PTR__socket_0010cba0;
    socket::close(&local_38,(int)&local_48);
  }
  else {
    (__return_storage_ptr__->val_).super_socket.handle_ = -1;
    (__return_storage_ptr__->val_).super_socket._vptr_socket = (_func_int **)&PTR__socket_0010ca00;
    *(ulong *)&__return_storage_ptr__->err_ = CONCAT44(local_60.err_._4_4_,local_60.err_._M_value);
    (__return_storage_ptr__->err_)._M_cat = local_60.err_._M_cat;
  }
  return __return_storage_ptr__;
}

Assistant:

result<acceptor> acceptor::create(int domain) noexcept {
    if (auto res = create_handle(domain); !res)
        return res.error();
    else
        return acceptor(res.value());
}